

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecpp.cpp
# Opt level: O2

int non_whitespace(QString *content,int pos)

{
  long lVar1;
  int i;
  ulong uVar2;
  
  lVar1 = (long)pos;
  while( true ) {
    if ((content->d).size <= lVar1) {
      return -1;
    }
    uVar2 = (ulong)(ushort)(content->d).ptr[lVar1];
    if ((0x20 < uVar2) || ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0)) break;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

int non_whitespace(const QString& content, int pos) {
    for(int i=pos;i<content.size();i++) {
        bool ws = content[i] == ' '
                || content[i] == '\t'
                || content[i] == '\r'
                || content[i] == '\n';
        if (!ws) {
            return i;
        }
    }
    return -1;
}